

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

void cleanup_slay(void)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < z_info->slay_max; uVar2 = uVar2 + 1) {
    string_free(*(char **)((long)&slays->code + lVar1));
    string_free(*(char **)((long)&slays->name + lVar1));
    string_free(*(char **)((long)&slays->base + lVar1));
    string_free(*(char **)((long)&slays->melee_verb + lVar1));
    string_free(*(char **)((long)&slays->range_verb + lVar1));
    lVar1 = lVar1 + 0x40;
  }
  mem_free(slays);
  return;
}

Assistant:

static void cleanup_slay(void)
{
	int idx;
	for (idx = 0; idx < z_info->slay_max; idx++) {
		string_free(slays[idx].code);
		string_free(slays[idx].name);
		string_free(slays[idx].base);
		string_free(slays[idx].melee_verb);
		string_free(slays[idx].range_verb);
	}
	mem_free(slays);
}